

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-get.c
# Opt level: O2

cn_cbor * cn_cbor_mapget_int(cn_cbor *cb,int key)

{
  cn_cbor *pcVar1;
  cn_cbor *pcVar2;
  cn_cbor **ppcVar3;
  
  if (cb == (cn_cbor *)0x0) {
    __assert_fail("cb",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-get.c"
                  ,0xc,"cn_cbor *cn_cbor_mapget_int(const cn_cbor *, int)");
  }
  ppcVar3 = &cb->first_child;
  while( true ) {
    pcVar1 = *ppcVar3;
    if ((pcVar1 == (cn_cbor *)0x0) || (pcVar2 = pcVar1->next, pcVar2 == (cn_cbor *)0x0)) {
      return (cn_cbor *)0x0;
    }
    if (((pcVar1->type == CN_CBOR_INT) || (pcVar1->type == CN_CBOR_UINT)) &&
       ((pcVar1->v).bytes == (uint8_t *)(long)key)) break;
    ppcVar3 = &pcVar2->next;
  }
  return pcVar2;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_mapget_int(const cn_cbor* cb, int key) {
  cn_cbor* cp;
  assert(cb);
  for (cp = cb->first_child; cp && cp->next; cp = cp->next->next) {
    switch(cp->type) {
    case CN_CBOR_UINT:
      if (cp->v.uint == (unsigned long)key) {
        return cp->next;
      }
      break;
    case CN_CBOR_INT:
      if (cp->v.sint == (long)key) {
        return cp->next;
      }
      break;
    default:
      ; // skip non-integer keys
    }
  }
  return NULL;
}